

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSNet.h
# Opt level: O1

int waitforcliforudpsrv(SOCKET socksrv,SOCKET *pSockCli,int timeout)

{
  int iVar1;
  ssize_t sVar2;
  int iVar3;
  timeval *__timeout;
  ulong uVar4;
  socklen_t addrlen;
  timeval tv;
  fd_set sock_set;
  char service [32];
  sockaddr_storage addr;
  char hostname [1025];
  char buf [65535];
  socklen_t sStack_1056c;
  timeval tStack_10568;
  fd_set fStack_10558;
  char acStack_104d8 [32];
  sockaddr sStack_104b8;
  undefined8 uStack_104a8;
  undefined8 uStack_104a0;
  undefined8 uStack_10498;
  undefined8 uStack_10490;
  undefined8 uStack_10488;
  undefined8 uStack_10480;
  undefined8 uStack_10478;
  undefined8 uStack_10470;
  undefined8 uStack_10468;
  undefined8 uStack_10460;
  undefined8 uStack_10458;
  undefined8 uStack_10450;
  undefined8 uStack_10448;
  undefined8 uStack_10440;
  char acStack_10438 [1040];
  undefined1 auStack_10028 [65536];
  
  sStack_1056c = 0x80;
  tStack_10568.tv_sec = (__time_t)(timeout / 1000);
  tStack_10568.tv_usec = (__suseconds_t)((timeout % 1000) * 1000);
  *pSockCli = -1;
  fStack_10558.fds_bits[0xe] = 0;
  fStack_10558.fds_bits[0xf] = 0;
  fStack_10558.fds_bits[0xc] = 0;
  fStack_10558.fds_bits[0xd] = 0;
  fStack_10558.fds_bits[10] = 0;
  fStack_10558.fds_bits[0xb] = 0;
  fStack_10558.fds_bits[8] = 0;
  fStack_10558.fds_bits[9] = 0;
  fStack_10558.fds_bits[6] = 0;
  fStack_10558.fds_bits[7] = 0;
  fStack_10558.fds_bits[4] = 0;
  fStack_10558.fds_bits[5] = 0;
  fStack_10558.fds_bits[2] = 0;
  fStack_10558.fds_bits[3] = 0;
  fStack_10558.fds_bits[0] = 0;
  fStack_10558.fds_bits[1] = 0;
  iVar3 = socksrv + 0x3f;
  if (-1 < socksrv) {
    iVar3 = socksrv;
  }
  uVar4 = 1L << ((byte)(socksrv % 0x40) & 0x3f);
  fStack_10558.fds_bits[iVar3 >> 6] = fStack_10558.fds_bits[iVar3 >> 6] | uVar4;
  if (timeout == 0) {
    __timeout = (timeval *)0x0;
  }
  else {
    __timeout = &tStack_10568;
  }
  iVar1 = select(socksrv + 1,&fStack_10558,(fd_set *)0x0,(fd_set *)0x0,__timeout);
  fStack_10558.fds_bits[iVar3 >> 6] = fStack_10558.fds_bits[iVar3 >> 6] & ~uVar4;
  iVar3 = 1;
  if (iVar1 != -1) {
    if (iVar1 == 0) {
      iVar3 = 2;
    }
    else {
      uStack_10448 = 0;
      uStack_10440 = 0;
      uStack_10458 = 0;
      uStack_10450 = 0;
      uStack_10468 = 0;
      uStack_10460 = 0;
      uStack_10478 = 0;
      uStack_10470 = 0;
      uStack_10488 = 0;
      uStack_10480 = 0;
      uStack_10498 = 0;
      uStack_10490 = 0;
      uStack_104a8 = 0;
      uStack_104a0 = 0;
      sStack_104b8.sa_family = 0;
      sStack_104b8.sa_data[0] = '\0';
      sStack_104b8.sa_data[1] = '\0';
      sStack_104b8.sa_data[2] = '\0';
      sStack_104b8.sa_data[3] = '\0';
      sStack_104b8.sa_data[4] = '\0';
      sStack_104b8.sa_data[5] = '\0';
      sStack_104b8.sa_data[6] = '\0';
      sStack_104b8.sa_data[7] = '\0';
      sStack_104b8.sa_data[8] = '\0';
      sStack_104b8.sa_data[9] = '\0';
      sStack_104b8.sa_data[10] = '\0';
      sStack_104b8.sa_data[0xb] = '\0';
      sStack_104b8.sa_data[0xc] = '\0';
      sStack_104b8.sa_data[0xd] = '\0';
      sStack_1056c = 0x80;
      sVar2 = recvfrom(socksrv,auStack_10028,0xffff,0,&sStack_104b8,&sStack_1056c);
      if (-1 < sVar2) {
        iVar1 = connect(socksrv,&sStack_104b8,sStack_1056c);
        if (iVar1 == 0) {
          iVar1 = getnameinfo(&sStack_104b8,sStack_1056c,acStack_10438,0x401,acStack_104d8,0x20,3);
          if (iVar1 == 0) {
            *pSockCli = socksrv;
            iVar3 = 0;
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

inline int waitforcliforudpsrv(SOCKET socksrv, SOCKET* pSockCli, int timeout)
{
	fd_set sock_set;
	int iResult = SOCKET_ERROR;
	struct timeval tv;
	struct sockaddr_storage addr;
	socklen_t addrlen = sizeof(struct sockaddr_storage);
	char hostname[NI_MAXHOST];
	char service[NI_MAXSERV];
	char buf[65535];

	tv.tv_sec = (long)(timeout/1000);
	tv.tv_usec = (long)((timeout%1000)*1000);

	*pSockCli = INVALID_SOCKET;

	// Initialize a fd_set and add the server socket to it.
	FD_ZERO(&sock_set); 
	FD_SET(socksrv, &sock_set);

	// Wait for the readability of the socket in the fd_set, with a timeout.
	if (timeout != 0)
	{
		iResult = select((int)socksrv+1, &sock_set, NULL, NULL, &tv);
	}
	else
	{
		iResult = select((int)socksrv+1, &sock_set, NULL, NULL, NULL);
	}

	// Remove the server socket from the set.
	// No need to use FD_ISSET() here, as we only have one socket the return value of select() is 
	// sufficient to know what happened.
	FD_CLR(socksrv, &sock_set); 

	if (iResult == SOCKET_ERROR)
	{
		PRINT_DEBUG_ERROR_OSNET(("waitforcliforudpsrv error (%s) : %s(socksrv=%d, timeout=%d)\n", 
			strtime_m(), 
			"select failed. ", 
			(int)socksrv, timeout));
		return EXIT_FAILURE;
	}

	if (iResult == 0)
	{ 
		PRINT_DEBUG_MESSAGE_OSNET(("waitforcliforudpsrv message (%s) : %s(socksrv=%d, timeout=%d)\n", 
			strtime_m(), 
			"select timed out. ", 
			(int)socksrv, timeout));
		return EXIT_TIMEOUT;
	}

	// First datagram will be lost...
	memset(&addr, 0, sizeof(addr));
	addrlen = sizeof(addr);
	if (recvfrom(socksrv, buf, sizeof(buf), 0, (struct sockaddr*)&addr, (socklen_t*)&addrlen) < 0)
	{
		PRINT_DEBUG_ERROR_OSNET(("waitforcliforudpsrv error (%s) : %s(socksrv=%d, timeout=%d)\n", 
			strtime_m(), 
			WSAGetLastErrorMsg(), 
			(int)socksrv, timeout));
		return EXIT_FAILURE;
	}

	// Should create a new socket connected to that client...?

	//// Create a UDP IPv4 socket.
	//*pSockCli = socket(AF_INET, SOCK_DGRAM, IPPROTO_UDP);
	//if (*pSockCli == INVALID_SOCKET)
	//{
	//	PRINT_DEBUG_ERROR_OSNET(("waitforcliforudpsrv error (%s) : %s(socksrv=%d, timeout=%d)\n", 
	//		strtime_m(), 
	//		WSAGetLastErrorMsg(), 
	//		(int)socksrv, timeout));
	//	return EXIT_FAILURE;
	//}

	//// Configure timeouts for send and recv.
	//if (setsockettimeouts(*pSockCli, DEFAULT_SOCK_TIMEOUT) != EXIT_SUCCESS)
	//{
	//	PRINT_DEBUG_ERROR_OSNET(("waitforcliforudpsrv error (%s) : %s(socksrv=%d, timeout=%d)\n", 
	//		strtime_m(), 
	//		WSAGetLastErrorMsg(), 
	//		(int)socksrv, timeout));
	//	closesocket(*pSockCli);
	//	return EXIT_FAILURE;
	//}
	
	// Set defaults for recv()... and send()...
	//if (connect(*pSockCli, (struct sockaddr*)&addr, addrlen) != EXIT_SUCCESS)
	if (connect(socksrv, (struct sockaddr*)&addr, addrlen) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_OSNET(("waitforcliforudpsrv error (%s) : %s(socksrv=%d, timeout=%d)\n", 
			strtime_m(), 
			WSAGetLastErrorMsg(), 
			(int)socksrv, timeout));
		//closesocket(*pSockCli);
		return EXIT_FAILURE;
	}

	// Display hostname and service.
	if (getnameinfo((struct sockaddr*)&addr, addrlen, hostname, NI_MAXHOST, service,
		NI_MAXSERV, NI_NUMERICHOST|NI_NUMERICSERV) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_OSNET(("waitforcliforudpsrv error (%s) : %s(socksrv=%d, timeout=%d)\n", 
			strtime_m(), 
			"getnameinfo failed. ", 
			(int)socksrv, timeout));
		//closesocket(*pSockCli);
		return EXIT_FAILURE;
	}

	PRINT_DEBUG_MESSAGE_OSNET(("Accepted connection from host %s and port %s\n", hostname, service));

	*pSockCli = socksrv;

	return EXIT_SUCCESS;
}